

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
           *this,InterfaceHandle *param_2,ValueFederate **param_3,InterfaceHandle *param_4,
          basic_string_view<char,_std::char_traits<char>_> *param_5,
          basic_string_view<char,_std::char_traits<char>_> *param_6)

{
  undefined8 uVar1;
  _Storage<unsigned_long,_true> _Var2;
  _Storage<unsigned_long,_true> _Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_bool> pVar4
  ;
  optional<unsigned_long> oVar5;
  size_t index;
  _Storage<unsigned_long,_true> local_20;
  
  _Var3 = (_Storage<unsigned_long,_true>)((_Storage<unsigned_long,_true> *)(this + 0xa8))->_M_value;
  local_20._M_value = (long)this + 0xa0;
  _Var2._M_value = local_20._M_value;
  if ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5> *)
      _Var3._M_value !=
      (DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5> *)0x0)
  {
    do {
      if (param_2->hid <= *(int *)(_Var3._M_value + 0x20)) {
        _Var2 = _Var3;
      }
      _Var3 = (_Storage<unsigned_long,_true>)
              ((_Storage<unsigned_long,_true> *)
              ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
                *)(_Var3._M_value + 0x10) +
              (ulong)(*(int *)(_Var3._M_value + 0x20) < param_2->hid) * 8))->_M_value;
    } while ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
              *)_Var3._M_value !=
             (DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
              *)0x0);
  }
  _Var3._M_value = local_20._M_value;
  if ((_Var2._M_value != local_20._M_value) &&
     (_Var3 = _Var2, param_2->hid < *(int *)(_Var2._M_value + 0x20))) {
    _Var3._M_value = local_20._M_value;
  }
  if (_Var3._M_value == local_20._M_value) {
    local_20 = *(_Storage<unsigned_long,_true> *)this;
    StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::
    emplace_back<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<helics::Input,5u,std::allocator<helics::Input>> *)this,param_3,
               param_4,param_5,param_6);
    pVar4 = std::
            _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::_Select1st<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
            ::_M_emplace_unique<helics::InterfaceHandle_const&,unsigned_long&>
                      ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::_Select1st<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
                        *)(this + 0x98),param_2,&local_20._M_value);
    uVar1 = CONCAT71(pVar4._9_7_,1);
  }
  else {
    uVar1 = 0;
  }
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_20._M_value;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            no_search_type /*searchValue1*/,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup2.find(searchValue2);
            if (fnd != lookup2.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            lookup2.emplace(searchValue2, index);
            return index;
        }